

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::VariablePatternSyntax::setChild
          (VariablePatternSyntax *this,size_t index,TokenOrSyntax child)

{
  logic_error *this_00;
  long lVar1;
  Token TVar2;
  long lStack_f0;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (index == 0) {
    lVar1 = 0x18;
    lStack_f0 = 0x10;
  }
  else {
    if (index != 1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_e1);
      std::operator+(&local_a0,&local_c0,":");
      std::__cxx11::to_string(&local_e0,0x359c);
      std::operator+(&local_80,&local_a0,&local_e0);
      std::operator+(&local_60,&local_80,": ");
      std::operator+(&local_40,&local_60,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar1 = 0x28;
    lStack_f0 = 0x20;
  }
  TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
  *(long *)((long)&(this->super_PatternSyntax).super_SyntaxNode.parent + lStack_f0) = TVar2._0_8_;
  *(Info **)((long)&(this->super_PatternSyntax).super_SyntaxNode.parent + lVar1) = TVar2.info;
  return;
}

Assistant:

void VariablePatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dot = child.token(); return;
        case 1: variableName = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}